

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O2

_Bool TMS320C64x_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  long lVar3;
  _Bool _Var4;
  DecodeStatus DVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint16_t uVar8;
  uint8_t *puVar9;
  MCInst *MI_00;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint local_54;
  DecodeStatus local_50;
  uint local_4c;
  MCInst *local_48;
  uint16_t *local_40;
  uint64_t local_38;
  
  if (3 < code_len) {
    __s = MI->flat_insn->detail;
    local_48 = MI;
    local_40 = size;
    local_38 = address;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x174);
    }
    uVar10 = *(uint *)code;
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    local_4c = ~uVar10;
    uVar12 = 0;
    local_50 = MCDisassembler_Success;
    puVar9 = DecoderTable32;
LAB_00248789:
    puVar13 = puVar9;
    MI_00 = local_48;
    switch(*puVar13) {
    case '\x01':
      bVar1 = puVar13[2];
      local_54 = (uint)bVar1;
      uVar12 = ~(-1 << (bVar1 & 0x1f)) << (puVar13[1] & 0x1f);
      if (bVar1 == 0x20) {
        uVar12 = 0xffffffff;
      }
      uVar12 = (uVar12 & uVar10) >> (puVar13[1] & 0x1f);
      puVar9 = puVar13 + 3;
      goto LAB_00248789;
    case '\x02':
      uVar6 = decodeULEB128(puVar13 + 1,&local_54);
      puVar9 = puVar13 + (ulong)local_54 + 3;
      if (uVar12 == (uint)uVar6) goto LAB_00248789;
      lVar3 = (ulong)local_54 + 1;
      break;
    case '\x03':
      bVar1 = puVar13[1];
      bVar2 = puVar13[2];
      local_54 = (uint)bVar2;
      uVar11 = ~(-1 << (bVar2 & 0x1f)) << (bVar1 & 0x1f);
      if (bVar2 == 0x20) {
        uVar11 = 0xffffffff;
      }
      uVar6 = decodeULEB128(puVar13 + 3,&local_54);
      puVar9 = puVar13 + (ulong)local_54 + 5;
      if ((uVar11 & uVar10) >> (bVar1 & 0x1f) == (uint)uVar6) goto LAB_00248789;
      lVar3 = (ulong)local_54 + 3;
      break;
    case '\x04':
      decodeULEB128(puVar13 + 1,&local_54);
      puVar9 = puVar13 + (ulong)local_54 + 3;
      goto LAB_00248789;
    case '\x05':
      goto switchD_002487a1_caseD_5;
    case '\x06':
      goto switchD_002487a1_caseD_6;
    default:
      goto switchD_002487a1_default;
    }
    puVar9 = puVar9 + *(ushort *)(puVar13 + lVar3);
    goto LAB_00248789;
  }
  uVar8 = 0;
  _Var4 = false;
LAB_00248944:
  *size = uVar8;
  return _Var4;
switchD_002487a1_caseD_6:
  uVar6 = decodeULEB128(puVar13 + 1,&local_54);
  puVar13 = puVar13 + (ulong)local_54 + 1;
  uVar7 = decodeULEB128(puVar13,&local_54);
  puVar9 = puVar13 + local_54;
  if (((uint)uVar7 & local_4c) != 0 || ((uint)uVar6 & uVar10) != 0) {
    local_50 = MCDisassembler_SoftFail;
  }
  goto LAB_00248789;
switchD_002487a1_caseD_5:
  uVar6 = decodeULEB128(puVar13 + 1,&local_54);
  uVar7 = decodeULEB128(puVar13 + (ulong)local_54 + 1,&local_54);
  MI_00 = local_48;
  MCInst_setOpcode(local_48,(uint)uVar6);
  DVar5 = decodeToMCInst_4(local_50,(uint)uVar7,uVar10,MI_00,local_38,(void *)address);
  if (DVar5 == MCDisassembler_Success) {
    _Var4 = true;
    uVar8 = 4;
    size = local_40;
  }
  else {
switchD_002487a1_default:
    MCInst_clear(MI_00);
    uVar8 = 0;
    _Var4 = false;
    size = local_40;
  }
  goto LAB_00248944;
}

Assistant:

bool TMS320C64x_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *MI, uint16_t *size, uint64_t address, void *info)
{
	uint32_t insn;
	DecodeStatus result;

	if(code_len < 4) {
		*size = 0;
		return MCDisassembler_Fail;
	}

	if(MI->flat_insn->detail)
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, tms320c64x)+sizeof(cs_tms320c64x));

	insn = (code[3] << 0) | (code[2] << 8) | (code[1] << 16) | ((uint32_t) code[0] << 24);
	result = decodeInstruction_4(DecoderTable32, MI, insn, address, info, 0);

	if(result == MCDisassembler_Success) {
		*size = 4;
		return true;
	}

	MCInst_clear(MI);
	*size = 0;
	return false;
}